

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *name;
  int iVar1;
  uint uVar2;
  test *ptVar3;
  ulong uVar4;
  ulong uVar5;
  int n;
  char **local_4040;
  test *tests_to_run [1024];
  test *tests [1024];
  
  uVar4 = 0;
  local_4040 = argv;
  memset(tests_to_run,0,0x2000);
  if (argc < 2) {
    if (0 < (long)test_count) {
      ptVar3 = ::tests;
      uVar4 = 0;
      do {
        tests_to_run[uVar4] = ptVar3;
        uVar4 = uVar4 + 1;
        ptVar3 = ptVar3 + 1;
      } while ((long)test_count != uVar4);
    }
  }
  else {
    uVar5 = 1;
    uVar4 = 0;
    do {
      memset(tests,0,0x2000);
      n = 0x400;
      name = local_4040[uVar5];
      search_tests(name,tests,&n);
      iVar1 = n;
      if ((ulong)(uint)n == 0) {
        fprintf(_stderr,"WARN: No tests matching \"%s\" found.\n",name);
      }
      else if (0 < n) {
        memcpy(tests_to_run + (int)uVar4,tests,(ulong)(uint)n << 3);
        uVar4 = (ulong)(uint)((int)uVar4 + iVar1);
      }
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
  }
  uVar2 = run_tests(tests_to_run,(int)uVar4);
  return uVar2 ^ 1;
}

Assistant:

int main(int argc, char *argv[]){
  struct test *tests_to_run[MAX_TESTS] = {0};
  int tests_to_runc = 0;
  if(1 < argc){
    for(int i=1; i<argc; ++i){
      struct test *tests[MAX_TESTS] = {0};
      int n = MAX_TESTS;
      search_tests(argv[i], tests, &n);
      if(n==0) fprintf(stderr, "WARN: No tests matching \"%s\" found.\n", argv[i]);
      else for(int j=0; j<n; ++j)
             tests_to_run[tests_to_runc++] = tests[j];
    }
  }else{
    for(int i=0; i<test_count; ++i){
      tests_to_run[tests_to_runc++] = &tests[i];
    }
  }

  return !run_tests(tests_to_run, tests_to_runc);
}